

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_interruption_error
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
           *this,context_run_mode *context,int32_t error_value)

{
  int iVar1;
  byte bVar2;
  int32_t k;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  
  k = context_run_mode::get_golomb_code(context);
  if (error_value < 1 || k != 0) {
    if (-1 < error_value) goto LAB_0012896e;
    iVar5 = -1;
    bVar2 = 1;
    if ((uint)context->n_ <= (uint)context->nn_ * 2) goto LAB_0012897e;
  }
  else {
    iVar5 = -1;
    if ((uint)context->nn_ * 2 < (uint)context->n_) goto LAB_0012897e;
LAB_0012896e:
    bVar2 = 0;
  }
  iVar5 = -(uint)(k != 0 & bVar2);
LAB_0012897e:
  iVar4 = -error_value;
  if (0 < error_value) {
    iVar4 = error_value;
  }
  iVar1 = context->run_interruption_type_;
  iVar3 = context_run_mode::compute_error_value(context,iVar5 + iVar4 * 2,k);
  if (iVar3 != error_value) {
    __assert_fail("error_value == context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x306,
                  "void charls::jls_codec<charls::default_traits<unsigned char, charls::triplet<unsigned char>>, charls::encoder_strategy>::encode_run_interruption_error(context_run_mode &, const int32_t) [Traits = charls::default_traits<unsigned char, charls::triplet<unsigned char>>, Strategy = charls::encoder_strategy]"
                 );
  }
  iVar5 = (iVar4 * 2 - iVar1) + iVar5;
  encode_mapped_value(this,k,iVar5,
                      ~*(uint *)(J + (long)this->run_index_ * 4) + (this->traits_).limit);
  context_run_mode::update_variables(context,error_value,iVar5,this->reset_threshold_);
  return;
}

Assistant:

void encode_run_interruption_error(context_run_mode& context, const int32_t error_value)
    {
        const int32_t k{context.get_golomb_code()};
        const bool map{context.compute_map(error_value, k)};
        const int32_t e_mapped_error_value{2 * std::abs(error_value) - context.run_interruption_type() -
                                           static_cast<int32_t>(map)};

        ASSERT(error_value == context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k));
        encode_mapped_value(k, e_mapped_error_value, traits_.limit - J[run_index_] - 1);
        context.update_variables(error_value, e_mapped_error_value, reset_threshold_);
    }